

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFUsedFont.cpp
# Opt level: O3

double __thiscall
PDFUsedFont::CalculateTextAdvance(PDFUsedFont *this,string *inText,double inFontSize)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  double dVar3;
  UIntList glyphs;
  _List_node_base local_30;
  undefined8 local_20;
  
  local_30._M_next = &local_30;
  local_20 = 0;
  local_30._M_prev = local_30._M_next;
  GetUnicodeGlyphs(this,inText,(UIntList *)local_30._M_next);
  dVar3 = CalculateTextAdvance(this,(UIntList *)&local_30,inFontSize);
  p_Var2 = local_30._M_next;
  while (p_Var2 != &local_30) {
    p_Var1 = (((_List_base<unsigned_int,_std::allocator<unsigned_int>_> *)&p_Var2->_M_next)->_M_impl
             )._M_node.super__List_node_base._M_next;
    operator_delete(p_Var2,0x18);
    p_Var2 = p_Var1;
  }
  return dVar3;
}

Assistant:

double PDFUsedFont::CalculateTextAdvance(const std::string& inText,double inFontSize)
{
	UIntList glyphs;
	GetUnicodeGlyphs(inText, glyphs);
	return CalculateTextAdvance(glyphs,inFontSize);
}